

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder_test.cpp
# Opt level: O0

void __thiscall forwarder::operator()(forwarder *this)

{
  exception *e;
  
  std::__shared_ptr_access<cppcms::service,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cppcms::service,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x10fec3);
  cppcms::service::run();
  fw_ok = true;
  return;
}

Assistant:

void operator()() const
	{
		try {
			srv->run();
		}
		catch(std::exception const &e) {
			std::cerr << "Forwarder error:" << e.what() << std::endl;
			fw_ok=false;
			return;
		}
		fw_ok=true;
	}